

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O2

void __thiscall
BS::thread_pool<(unsigned_char)'\x00'>::worker
          (thread_pool<(unsigned_char)__x00_> *this,stop_token *stop_token,size_t idx)

{
  _Stop_state_t *p_Var1;
  size_t sVar2;
  long in_FS_OFFSET;
  unique_lock<std::mutex> tasks_lock;
  task_t task;
  _Stop_state_ref local_80;
  size_t local_78;
  condition_variable *local_70;
  mutex *local_68;
  unique_lock<std::mutex> local_60;
  task_t local_50;
  
  if (*(char *)(in_FS_OFFSET + -0x50) == '\0') {
    *(undefined1 *)(in_FS_OFFSET + -0x50) = 1;
  }
  *(thread_pool<(unsigned_char)__x00_> **)(in_FS_OFFSET + -0x58) = this;
  *(size_t *)(in_FS_OFFSET + -0x48) = idx;
  *(undefined1 *)(in_FS_OFFSET + -0x40) = 1;
  local_78 = idx;
  std::function<void_(unsigned_long)>::operator()(&this->init_func,idx);
  local_68 = &this->tasks_mutex;
  local_70 = &this->tasks_done_cv;
  while( true ) {
    std::unique_lock<std::mutex>::unique_lock(&local_60,local_68);
    sVar2 = this->tasks_running - 1;
    this->tasks_running = sVar2;
    if (((sVar2 == 0 & this->waiting) == 1) &&
       ((this->tasks).c.
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (this->tasks).c.
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur)) {
      std::condition_variable::notify_all();
    }
    local_80._M_ptr = (stop_token->_M_state)._M_ptr;
    if (local_80._M_ptr != (_Stop_state_t *)0x0) {
      LOCK();
      ((local_80._M_ptr)->_M_owners).super___atomic_base<unsigned_int>._M_i =
           ((local_80._M_ptr)->_M_owners).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    std::_V2::condition_variable_any::
    wait<std::unique_lock<std::mutex>,BS::thread_pool<(unsigned_char)0>::worker(std::stop_token_const&,unsigned_long)::_lambda()_1_>
              (&this->task_available_cv,&local_60,(stop_token *)&local_80,
               (anon_class_8_1_8991fb9c)this);
    std::stop_token::_Stop_state_ref::~_Stop_state_ref(&local_80);
    p_Var1 = (stop_token->_M_state)._M_ptr;
    if ((p_Var1 != (_Stop_state_t *)0x0) &&
       (((p_Var1->_M_value).super___atomic_base<unsigned_int>._M_i & 1) != 0)) break;
    pop_task(&local_50,this);
    this->tasks_running = this->tasks_running + 1;
    std::unique_lock<std::mutex>::unlock(&local_60);
    std::function<void_()>::operator()(&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::unique_lock<std::mutex>::~unique_lock(&local_60);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_60);
  std::function<void_(unsigned_long)>::operator()(&this->cleanup_func,local_78);
  if (*(char *)(in_FS_OFFSET + -0x40) != '\0') {
    *(undefined1 *)(in_FS_OFFSET + -0x40) = 0;
  }
  if (*(char *)(in_FS_OFFSET + -0x50) == '\x01') {
    *(undefined1 *)(in_FS_OFFSET + -0x50) = 0;
  }
  return;
}

Assistant:

void worker(BS_THREAD_POOL_WORKER_TOKEN const std::size_t idx)
    {
        this_thread::my_pool = this;
        this_thread::my_index = idx;
        init_func(idx);
        while (true)
        {
            std::unique_lock tasks_lock(tasks_mutex);
            --tasks_running;
            if constexpr (pause_enabled)
            {
                if (waiting && (tasks_running == 0) && (paused || tasks.empty()))
                    tasks_done_cv.notify_all();
            }
            else
            {
                if (waiting && (tasks_running == 0) && tasks.empty())
                    tasks_done_cv.notify_all();
            }
            task_available_cv.wait(tasks_lock BS_THREAD_POOL_WAIT_TOKEN,
                [this]
                {
                    if constexpr (pause_enabled)
                        return !(paused || tasks.empty()) BS_THREAD_POOL_OR_STOP_CONDITION;
                    else
                        return !tasks.empty() BS_THREAD_POOL_OR_STOP_CONDITION;
                });
            if (BS_THREAD_POOL_STOP_CONDITION)
                break;
            {
                task_t task = pop_task(); // NOLINT(misc-const-correctness) In C++23 this cannot be const since `std::move_only_function::operator()` is not a const member function.
                ++tasks_running;
                tasks_lock.unlock();
#ifdef __cpp_exceptions
                try
                {
#endif
                    task();
#ifdef __cpp_exceptions
                }
                catch (...)
                {
                }
#endif
            }
        }
        cleanup_func(idx);
        this_thread::my_index = std::nullopt;
        this_thread::my_pool = std::nullopt;
    }